

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

bc_string_t * bc_string_append_escaped(bc_string_t *str,char *suffix)

{
  char c;
  bool bVar1;
  bool bVar2;
  
  if (str == (bc_string_t *)0x0) {
    return (bc_string_t *)0x0;
  }
  if (suffix == (char *)0x0) {
    return str;
  }
  bVar2 = false;
  do {
    c = *suffix;
    if (c == '\\') {
      bVar1 = true;
      if (bVar2) goto LAB_00109e7a;
    }
    else {
      if (c == '\0') {
        return str;
      }
LAB_00109e7a:
      str = bc_string_append_c(str,c);
      bVar1 = false;
    }
    bVar2 = bVar1;
    suffix = suffix + 1;
  } while( true );
}

Assistant:

bc_string_t*
bc_string_append_escaped(bc_string_t *str, const char *suffix)
{
    if (str == NULL)
        return NULL;
    if (suffix == NULL)
        return str;
    bool escaped = false;
    for (size_t i = 0; suffix[i] != '\0'; i++) {
        if (suffix[i] == '\\' && !escaped) {
            escaped = true;
            continue;
        }
        escaped = false;
        str = bc_string_append_c(str, suffix[i]);
    }
    return str;
}